

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window.cpp
# Opt level: O0

void window_uncommon_slot(Am_Slot first_invalidated)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  Am_Value *pAVar5;
  Am_Ptr pvVar6;
  char *pcVar7;
  Am_Wrapper *pAVar8;
  Am_Style *this;
  Am_Cursor *this_00;
  Am_Wrapper *pAVar9;
  int local_90;
  int local_8c;
  int height;
  int width;
  Am_Style local_80;
  Am_Object local_78;
  Am_Object local_70;
  Am_Object local_68;
  Am_Object local_60;
  Am_Object owner;
  bool title_p;
  Am_String local_48;
  Am_Window_ToDo *local_40;
  Am_Window_ToDo *win_todo;
  Am_Drawonable *drawonable;
  Am_Object local_20;
  Am_Object local_18;
  Am_Object window;
  Am_Slot first_invalidated_local;
  
  window.data = (Am_Object_Data *)first_invalidated.data;
  Am_Slot::Get_Owner((Am_Slot *)&local_20);
  Am_Object::Am_Object(&local_18,&local_20);
  Am_Object_Advanced::~Am_Object_Advanced((Am_Object_Advanced *)&local_20);
  pAVar5 = Am_Object::Get(&local_18,0x7d2,0);
  pvVar6 = Am_Value::operator_cast_to_void_(pAVar5);
  win_todo = (Am_Window_ToDo *)Am_Drawonable::Narrow(pvVar6);
  if ((Am_Drawonable *)win_todo != (Am_Drawonable *)0x0) {
    pAVar5 = Am_Object::Get(&local_18,0x7d6,0);
    pvVar6 = Am_Value::operator_cast_to_void_(pAVar5);
    local_40 = Am_Window_ToDo::Narrow(pvVar6);
    bVar1 = Am_Drawonable::Get_Visible((Am_Drawonable *)win_todo);
    pAVar5 = Am_Object::Get(&local_18,0x69,0);
    bVar2 = Am_Value::operator_cast_to_bool(pAVar5);
    if (bVar1 != bVar2) {
      local_40->flags = local_40->flags | 0x10;
      Am_Window_ToDo::Add(local_40);
    }
    pAVar5 = Am_Object::Get(&local_18,0x6c,0);
    Am_String::Am_String(&local_48,pAVar5);
    pcVar7 = Am_Drawonable::Get_Title((Am_Drawonable *)win_todo);
    bVar1 = Am_String::operator==(&local_48,pcVar7);
    Am_String::~Am_String(&local_48);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      local_40->flags = local_40->flags | 0x80;
      Am_Window_ToDo::Add(local_40);
    }
    pAVar5 = Am_Object::Get(&local_18,0x6d,0);
    Am_String::Am_String((Am_String *)&stack0xffffffffffffffb0,pAVar5);
    pcVar7 = Am_Drawonable::Get_Icon_Title((Am_Drawonable *)win_todo);
    bVar1 = Am_String::operator==((Am_String *)&stack0xffffffffffffffb0,pcVar7);
    Am_String::~Am_String((Am_String *)&stack0xffffffffffffffb0);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      local_40->flags = local_40->flags | 0x100;
      Am_Window_ToDo::Add(local_40);
    }
    bVar1 = Am_Drawonable::Get_Iconify((Am_Drawonable *)win_todo);
    pAVar5 = Am_Object::Get(&local_18,0x76,0);
    bVar2 = Am_Value::operator_cast_to_bool(pAVar5);
    if (bVar1 != bVar2) {
      local_40->flags = local_40->flags | 0x2000;
      Am_Window_ToDo::Add(local_40);
    }
    Am_Drawonable::Get_Titlebar((Am_Drawonable *)win_todo,(bool *)((long)&owner.data + 7));
    pAVar5 = Am_Object::Get(&local_18,0x79,0);
    bVar1 = Am_Value::operator_cast_to_bool(pAVar5);
    if ((bool)(owner.data._7_1_ & 1) == bVar1) {
      Am_Object::Get_Owner(&local_60,(Am_Slot_Flags)&local_18);
      while (pAVar8 = Am_Object::operator_cast_to_Am_Wrapper_(&local_60),
            pAVar8 != (Am_Wrapper *)0x0) {
        Am_Object::Am_Object(&local_68,&Am_Screen);
        bVar1 = Am_Object::Is_Instance_Of(&local_60,&local_68);
        Am_Object::~Am_Object(&local_68);
        if (bVar1) {
          local_40->flags = local_40->flags | 0x200;
          Am_Window_ToDo::Add(local_40);
          break;
        }
        Am_Object::Am_Object(&local_70,&Am_Window);
        bVar1 = Am_Object::Is_Instance_Of(&local_60,&local_70);
        Am_Object::~Am_Object(&local_70);
        if (bVar1) break;
        Am_Object::Get_Owner(&local_78,(Am_Slot_Flags)&local_60);
        Am_Object::operator=(&local_60,&local_78);
        Am_Object::~Am_Object(&local_78);
      }
      Am_Object::~Am_Object(&local_60);
    }
    this = Am_Drawonable::Get_Background_Color((Am_Drawonable *)win_todo);
    pAVar5 = Am_Object::Get(&local_18,0x6a,0);
    Am_Style::Am_Style(&local_80,pAVar5);
    bVar1 = Am_Style::operator!=(this,&local_80);
    Am_Style::~Am_Style(&local_80);
    if (bVar1) {
      local_40->flags = local_40->flags | 0x400;
      Am_Window_ToDo::Add(local_40);
    }
    this_00 = (Am_Cursor *)(*(code *)(win_todo->window).data[1].data.data)();
    pAVar8 = Am_Cursor::operator_cast_to_Am_Wrapper_(this_00);
    pAVar5 = Am_Object::Get(&local_18,0x7e,0);
    Am_Cursor::Am_Cursor((Am_Cursor *)&height,pAVar5);
    pAVar9 = Am_Cursor::operator_cast_to_Am_Wrapper_((Am_Cursor *)&height);
    Am_Cursor::~Am_Cursor((Am_Cursor *)&height);
    if (pAVar8 != pAVar9) {
      local_40->flags = local_40->flags | 0x8000;
      Am_Window_ToDo::Add(local_40);
    }
    Am_Drawonable::Get_Min_Size((Am_Drawonable *)win_todo,&local_8c,&local_90);
    pAVar5 = Am_Object::Get(&local_18,0x74,0);
    bVar1 = Am_Value::operator_cast_to_bool(pAVar5);
    iVar4 = local_8c;
    if (bVar1) {
      pAVar5 = Am_Object::Get(&local_18,0x70,0);
      iVar3 = Am_Value::operator_cast_to_int(pAVar5);
      if (iVar4 != iVar3) {
        local_40->flags = local_40->flags | 0x800;
        Am_Window_ToDo::Add(local_40);
      }
    }
    else if (local_8c != 1) {
      local_40->flags = local_40->flags | 0x800;
      Am_Window_ToDo::Add(local_40);
    }
    pAVar5 = Am_Object::Get(&local_18,0x75,0);
    bVar1 = Am_Value::operator_cast_to_bool(pAVar5);
    iVar4 = local_90;
    if (bVar1) {
      pAVar5 = Am_Object::Get(&local_18,0x71,0);
      iVar3 = Am_Value::operator_cast_to_int(pAVar5);
      if (iVar4 != iVar3) {
        local_40->flags = local_40->flags | 0x800;
        Am_Window_ToDo::Add(local_40);
      }
    }
    else if (local_90 != 1) {
      local_40->flags = local_40->flags | 0x800;
      Am_Window_ToDo::Add(local_40);
    }
    Am_Drawonable::Get_Max_Size((Am_Drawonable *)win_todo,&local_8c,&local_90);
    pAVar5 = Am_Object::Get(&local_18,0x72,0);
    bVar1 = Am_Value::operator_cast_to_bool(pAVar5);
    if (bVar1) {
      pAVar5 = Am_Object::Get(&local_18,0x6e,0);
      iVar4 = Am_Value::operator_cast_to_int(pAVar5);
      if (local_8c != iVar4) {
        local_40->flags = local_40->flags | 0x1000;
        Am_Window_ToDo::Add(local_40);
      }
    }
    else if (local_8c != 0) {
      local_40->flags = local_40->flags | 0x1000;
      Am_Window_ToDo::Add(local_40);
    }
    pAVar5 = Am_Object::Get(&local_18,0x73,0);
    bVar1 = Am_Value::operator_cast_to_bool(pAVar5);
    if (bVar1) {
      pAVar5 = Am_Object::Get(&local_18,0x6f,0);
      iVar4 = Am_Value::operator_cast_to_int(pAVar5);
      if (local_90 != iVar4) {
        local_40->flags = local_40->flags | 0x1000;
        Am_Window_ToDo::Add(local_40);
      }
    }
    else if (local_90 != 0) {
      local_40->flags = local_40->flags | 0x1000;
      Am_Window_ToDo::Add(local_40);
    }
  }
  Am_Object::~Am_Object(&local_18);
  return;
}

Assistant:

static void
window_uncommon_slot(Am_Slot first_invalidated)
{
  Am_Object window = first_invalidated.Get_Owner();
  Am_Drawonable *drawonable = Am_Drawonable::Narrow(window.Get(Am_DRAWONABLE));
  if (drawonable) {
    Am_Window_ToDo *win_todo = Am_Window_ToDo::Narrow(window.Get(Am_TODO));
    if (drawonable->Get_Visible() != (bool)window.Get(Am_VISIBLE)) {
      win_todo->flags |= Am_WINTODO_VISIBLE;
      win_todo->Add();
    }
    if (!(Am_String(window.Get(Am_TITLE)) == drawonable->Get_Title())) {
      win_todo->flags |= Am_WINTODO_TITLE;
      win_todo->Add();
    }
    if (!(Am_String(window.Get(Am_ICON_TITLE)) ==
          drawonable->Get_Icon_Title())) {
      win_todo->flags |= Am_WINTODO_ICON_TITLE;
      win_todo->Add();
    }
    if (drawonable->Get_Iconify() != (bool)window.Get(Am_ICONIFIED)) {
      win_todo->flags |= Am_WINTODO_ICONIFY;
      win_todo->Add();
    }
    bool title_p;
    drawonable->Get_Titlebar(title_p);
    if (title_p == (bool)window.Get(Am_OMIT_TITLE_BAR)) {
      Am_Object owner = window.Get_Owner();
      while (owner) {
        if (owner.Is_Instance_Of(Am_Screen)) {
          win_todo->flags |= Am_WINTODO_TITLE_BAR;
          win_todo->Add();
          break;
        } else if (owner.Is_Instance_Of(Am_Window))
          break;
        owner = owner.Get_Owner();
      }
    }
    if (drawonable->Get_Background_Color() !=
        Am_Style(window.Get(Am_FILL_STYLE))) {
      win_todo->flags |= Am_WINTODO_FILL_STYLE;
      win_todo->Add();
    }
    if (drawonable->Get_Cursor() != (Am_Cursor)window.Get(Am_CURSOR)) {
      win_todo->flags |= Am_WINTODO_CURSOR;
      win_todo->Add();
    }
    int width, height;
    drawonable->Get_Min_Size(width, height);
    if ((bool)window.Get(Am_USE_MIN_WIDTH)) {
      if (width != (int)window.Get(Am_MIN_WIDTH)) {
        win_todo->flags |= Am_WINTODO_MIN_SIZE;
        win_todo->Add();
      }
    } else if (width != 1) {
      win_todo->flags |= Am_WINTODO_MIN_SIZE;
      win_todo->Add();
    }
    if ((bool)window.Get(Am_USE_MIN_HEIGHT)) {
      if (height != (int)window.Get(Am_MIN_HEIGHT)) {
        win_todo->flags |= Am_WINTODO_MIN_SIZE;
        win_todo->Add();
      }
    } else if (height != 1) {
      win_todo->flags |= Am_WINTODO_MIN_SIZE;
      win_todo->Add();
    }
    drawonable->Get_Max_Size(width, height);
    if ((bool)window.Get(Am_USE_MAX_WIDTH)) {
      if (width != (int)window.Get(Am_MAX_WIDTH)) {
        win_todo->flags |= Am_WINTODO_MAX_SIZE;
        win_todo->Add();
      }
    } else if (width != 0) {
      win_todo->flags |= Am_WINTODO_MAX_SIZE;
      win_todo->Add();
    }
    if ((bool)window.Get(Am_USE_MAX_HEIGHT)) {
      if (height != (int)window.Get(Am_MAX_HEIGHT)) {
        win_todo->flags |= Am_WINTODO_MAX_SIZE;
        win_todo->Add();
      }
    } else if (height != 0) {
      win_todo->flags |= Am_WINTODO_MAX_SIZE;
      win_todo->Add();
    }
    //// NDY: These need to be defined in gem.
    // Am_CLIP_CHILDREN  Am_WINTODO_CLIP
    // Am_SAVE_UNDER     Am_WINTODO_SAVE_UNDER
  }
}